

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

Image * GenImageGradientSquare
                  (Image *__return_storage_ptr__,int width,int height,float density,Color inner,
                  Color outer)

{
  char cVar1;
  short sVar5;
  short sVar6;
  short sVar7;
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  unkuint9 Var12;
  undefined1 auVar13 [11];
  undefined1 auVar14 [13];
  undefined1 auVar15 [14];
  undefined1 auVar16 [11];
  undefined1 auVar17 [13];
  undefined1 auVar18 [14];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  uint6 uVar23;
  uint6 uVar24;
  void *pvVar25;
  ulong uVar26;
  void *pvVar27;
  ulong uVar28;
  ulong uVar29;
  int x;
  ulong uVar30;
  short sVar31;
  float fVar32;
  undefined1 auVar35 [16];
  ushort uVar36;
  ushort uVar37;
  float fVar38;
  char cVar2;
  char cVar3;
  char cVar4;
  undefined4 uVar33;
  undefined6 uVar34;
  
  pvVar25 = malloc((long)(height * width) << 2);
  Var12 = CONCAT81(SUB158(ZEXT815(0),7),outer.a);
  auVar19._9_6_ = 0;
  auVar19._0_9_ = Var12;
  auVar13._1_10_ = SUB1510(auVar19 << 0x30,5);
  auVar13[0] = outer.b;
  auVar20._11_4_ = 0;
  auVar20._0_11_ = auVar13;
  auVar14._1_12_ = SUB1512(auVar20 << 0x20,3);
  auVar14[0] = outer.g;
  uVar36 = CONCAT11(0,outer.r);
  auVar11._2_13_ = auVar14;
  auVar11._0_2_ = uVar36;
  auVar9._10_2_ = 0;
  auVar9._0_10_ = auVar11._0_10_;
  auVar9._12_2_ = (short)Var12;
  uVar23 = CONCAT42(auVar9._10_4_,auVar13._0_2_);
  auVar15._6_8_ = 0;
  auVar15._0_6_ = uVar23;
  Var12 = CONCAT81(SUB158(ZEXT815(0),7),inner.a);
  auVar21._9_6_ = 0;
  auVar21._0_9_ = Var12;
  auVar16._1_10_ = SUB1510(auVar21 << 0x30,5);
  auVar16[0] = inner.b;
  auVar22._11_4_ = 0;
  auVar22._0_11_ = auVar16;
  auVar17._1_12_ = SUB1512(auVar22 << 0x20,3);
  auVar17[0] = inner.g;
  uVar37 = CONCAT11(0,inner.r);
  auVar10._2_13_ = auVar17;
  auVar10._0_2_ = uVar37;
  auVar8._10_2_ = 0;
  auVar8._0_10_ = auVar10._0_10_;
  auVar8._12_2_ = (short)Var12;
  uVar24 = CONCAT42(auVar8._10_4_,auVar16._0_2_);
  auVar18._6_8_ = 0;
  auVar18._0_6_ = uVar24;
  uVar28 = 0;
  uVar29 = 0;
  if (0 < width) {
    uVar29 = (ulong)(uint)width;
  }
  uVar26 = 0;
  if (0 < height) {
    uVar26 = (ulong)(uint)height;
  }
  pvVar27 = pvVar25;
  for (; uVar28 != uVar26; uVar28 = uVar28 + 1) {
    for (uVar30 = 0; uVar29 != uVar30; uVar30 = uVar30 + 1) {
      fVar32 = fmaxf(ABS((float)(int)uVar30 - (float)width * 0.5) / ((float)width * 0.5),
                     ABS((float)(int)uVar28 - (float)height * 0.5) / ((float)height * 0.5));
      fVar32 = (fVar32 - density) / (1.0 - density);
      if (fVar32 <= 0.0) {
        fVar32 = 0.0;
      }
      if (1.0 <= fVar32) {
        fVar32 = 1.0;
      }
      fVar38 = 1.0 - fVar32;
      auVar35._0_4_ = (int)(fVar38 * (float)uVar37 + fVar32 * (float)uVar36);
      auVar35._4_4_ =
           (int)(fVar38 * (float)(int)CONCAT82(SUB148(auVar18 << 0x40,6),auVar17._0_2_) +
                fVar32 * (float)(int)CONCAT82(SUB148(auVar15 << 0x40,6),auVar14._0_2_));
      auVar35._8_4_ = (int)(fVar38 * (float)(int)uVar24 + fVar32 * (float)(int)uVar23);
      auVar35._12_4_ =
           (int)(fVar38 * (float)(auVar8._10_4_ >> 0x10) + fVar32 * (float)(auVar9._10_4_ >> 0x10));
      auVar35 = auVar35 & _DAT_00174250;
      sVar5 = auVar35._0_2_;
      cVar1 = (0 < sVar5) * (sVar5 < 0x100) * auVar35[0] - (0xff < sVar5);
      sVar5 = auVar35._2_2_;
      sVar31 = CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar35[2] - (0xff < sVar5),cVar1);
      sVar5 = auVar35._4_2_;
      cVar2 = (0 < sVar5) * (sVar5 < 0x100) * auVar35[4] - (0xff < sVar5);
      sVar5 = auVar35._6_2_;
      uVar33 = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar35[6] - (0xff < sVar5),
                        CONCAT12(cVar2,sVar31));
      sVar5 = auVar35._8_2_;
      cVar3 = (0 < sVar5) * (sVar5 < 0x100) * auVar35[8] - (0xff < sVar5);
      sVar5 = auVar35._10_2_;
      uVar34 = CONCAT15((0 < sVar5) * (sVar5 < 0x100) * auVar35[10] - (0xff < sVar5),
                        CONCAT14(cVar3,uVar33));
      sVar5 = auVar35._12_2_;
      cVar4 = (0 < sVar5) * (sVar5 < 0x100) * auVar35[0xc] - (0xff < sVar5);
      sVar7 = auVar35._14_2_;
      sVar5 = (short)((uint)uVar33 >> 0x10);
      sVar6 = (short)((uint6)uVar34 >> 0x20);
      sVar7 = (short)(CONCAT17((0 < sVar7) * (sVar7 < 0x100) * auVar35[0xe] - (0xff < sVar7),
                               CONCAT16(cVar4,uVar34)) >> 0x30);
      *(uint *)((long)pvVar27 + uVar30 * 4) =
           CONCAT13((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7),
                    CONCAT12((0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6),
                             CONCAT11((0 < sVar5) * (sVar5 < 0x100) * cVar2 - (0xff < sVar5),
                                      (0 < sVar31) * (sVar31 < 0x100) * cVar1 - (0xff < sVar31))));
    }
    pvVar27 = (void *)((long)pvVar27 + (long)width * 4);
  }
  __return_storage_ptr__->data = pvVar25;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImageGradientSquare(int width, int height, float density, Color inner, Color outer)
{
    Color *pixels = (Color *)RL_MALLOC(width*height*sizeof(Color));

    float centerX = (float)width/2.0f;
    float centerY = (float)height/2.0f;

    for (int y = 0; y < height; y++)
    {
        for (int x = 0; x < width; x++)
        {
            // Calculate the Manhattan distance from the center
            float distX = fabsf(x - centerX);
            float distY = fabsf(y - centerY);

            // Normalize the distances by the dimensions of the gradient rectangle
            float normalizedDistX = distX/centerX;
            float normalizedDistY = distY/centerY;

            // Calculate the total normalized Manhattan distance
            float manhattanDist = fmaxf(normalizedDistX, normalizedDistY);

            // Subtract the density from the manhattanDist, then divide by (1 - density)
            // This makes the gradient start from the center when density is 0, and from the edge when density is 1
            float factor = (manhattanDist - density)/(1.0f - density);

            // Clamp the factor between 0 and 1
            factor = fminf(fmaxf(factor, 0.0f), 1.0f);

            // Blend the colors based on the calculated factor
            pixels[y*width + x].r = (int)((float)outer.r*factor + (float)inner.r*(1.0f - factor));
            pixels[y*width + x].g = (int)((float)outer.g*factor + (float)inner.g*(1.0f - factor));
            pixels[y*width + x].b = (int)((float)outer.b*factor + (float)inner.b*(1.0f - factor));
            pixels[y*width + x].a = (int)((float)outer.a*factor + (float)inner.a*(1.0f - factor));
        }
    }

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}